

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqlite_kv_delete(unqlite *pDb,void *pKey,int nKeyLen)

{
  unqlite_kv_methods *puVar1;
  unqlite_kv_cursor *puVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  
  iVar4 = -0x18;
  if ((pDb != (unqlite *)0x0) && (pDb->nMagic == 0xdb7c2712)) {
    puVar1 = ((pDb->sDB).pPager)->pEngine->pIo->pMethods;
    if (puVar1->xDelete == (_func_int_unqlite_kv_cursor_ptr *)0x0) {
      unqliteGenError(pDb,"xDelete() method not implemented in the underlying storage engine");
      iVar4 = -0x11;
    }
    else {
      if (nKeyLen < 0) {
        pcVar5 = (char *)pKey;
        if (*pKey != '\0') {
          pcVar3 = (char *)((long)pKey + 2);
          do {
            pcVar5 = pcVar3;
            if (pcVar5[-1] == '\0') {
              pcVar5 = pcVar5 + -1;
              goto LAB_0010e03c;
            }
            if (*pcVar5 == '\0') goto LAB_0010e03c;
            if (pcVar5[1] == '\0') {
              pcVar5 = pcVar5 + 1;
              goto LAB_0010e03c;
            }
            pcVar3 = pcVar5 + 4;
          } while (pcVar5[2] != '\0');
          pcVar5 = pcVar5 + 2;
        }
LAB_0010e03c:
        nKeyLen = (int)pcVar5 - (int)pKey;
      }
      if (nKeyLen == 0) {
        unqliteGenError(pDb,"Empty key");
        iVar4 = -3;
      }
      else {
        puVar2 = (pDb->sDB).pCursor;
        iVar4 = (*puVar1->xSeek)(puVar2,pKey,nKeyLen,1);
        if (iVar4 == 0) {
          iVar4 = (*puVar1->xDelete)(puVar2);
          return iVar4;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int unqlite_kv_delete(unqlite *pDb,const void *pKey,int nKeyLen)
{
	unqlite_kv_methods *pMethods;
	unqlite_kv_engine *pEngine;
	unqlite_kv_cursor *pCur;
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) ){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /* Point to the underlying storage engine */
	 pEngine = unqlitePagerGetKvEngine(pDb);
	 pMethods = pEngine->pIo->pMethods;
	 pCur = pDb->sDB.pCursor;
	 if( pMethods->xDelete == 0 ){
		 /* Storage engine does not implement such method */
		 unqliteGenError(pDb,"xDelete() method not implemented in the underlying storage engine");
		 rc = UNQLITE_NOTIMPLEMENTED;
	 }else{
		 if( nKeyLen < 0 ){
			 /* Assume a null terminated string and compute it's length */
			 nKeyLen = SyStrlen((const char *)pKey);
		 }
		 if( !nKeyLen ){
			 unqliteGenError(pDb,"Empty key");
			 rc = UNQLITE_EMPTY;
		 }else{
			 /* Seek to the record position */
			 rc = pMethods->xSeek(pCur,pKey,nKeyLen,UNQLITE_CURSOR_MATCH_EXACT);
		 }
		 if( rc == UNQLITE_OK ){
			 /* Exact match found, delete the entry */
			 rc = pMethods->xDelete(pCur);
		 }
	 }
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}